

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patas_scan.hpp
# Opt level: O1

void __thiscall
duckdb::PatasScanState<float>::LoadGroup<false>
          (PatasScanState<float> *this,EXACT_TYPE *value_buffer)

{
  data_ptr_t pdVar1;
  ushort uVar2;
  data_ptr_t pdVar3;
  idx_t iVar4;
  idx_t iVar5;
  idx_t count;
  uint8_t *puVar6;
  long lVar7;
  
  (this->group_state).index = 0;
  pdVar3 = this->metadata_ptr;
  pdVar1 = pdVar3 + -4;
  this->metadata_ptr = pdVar1;
  iVar4 = this->count;
  iVar5 = this->total_value_count;
  count = iVar4 - iVar5;
  if (0x3ff < count) {
    count = 0x400;
  }
  (this->group_state).byte_reader.buffer = this->segment_data + *(uint *)(pdVar3 + -4);
  (this->group_state).byte_reader.index = 0;
  this->metadata_ptr = pdVar1 + -(ulong)(uint)((int)count * 2);
  if (iVar4 != iVar5) {
    lVar7 = -count;
    puVar6 = &(this->group_state).unpacked_data[0].index_diff;
    do {
      uVar2 = *(ushort *)(pdVar1 + lVar7 * 2);
      *puVar6 = (byte)(uVar2 >> 9);
      ((PatasUnpackedValueStats *)(puVar6 + -2))->significant_bytes = (byte)(uVar2 >> 6) & 7;
      puVar6[-1] = (byte)uVar2 & 0x1f;
      puVar6 = puVar6 + 3;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0);
  }
  PatasGroupState<unsigned_int>::LoadValues<false>(&this->group_state,value_buffer,count);
  return;
}

Assistant:

void Reset() {
		index = 0;
	}